

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayIndexEnumerator.cpp
# Opt level: O1

void __thiscall
Js::ES5ArrayIndexEnumerator::ES5ArrayIndexEnumerator
          (ES5ArrayIndexEnumerator *this,ES5Array *arrayObject,EnumeratorFlags flags,
          ScriptContext *scriptContext)

{
  JavascriptArrayIndexEnumeratorBase::JavascriptArrayIndexEnumeratorBase
            (&this->super_JavascriptArrayIndexEnumeratorBase,&arrayObject->super_JavascriptArray,
             flags,scriptContext);
  (this->super_JavascriptArrayIndexEnumeratorBase).super_JavascriptEnumerator.super_RecyclableObject
  .super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_0150ab10;
  (this->descriptor).ptr = (IndexPropertyDescriptor *)0x0;
  (this->descriptorValidationToken).ptr = (void *)0x0;
  this->initialLength =
       (((this->super_JavascriptArrayIndexEnumeratorBase).arrayObject.ptr)->super_ArrayObject).
       length;
  this->dataIndex = 0xffffffff;
  this->descriptorIndex = 0xffffffff;
  (this->descriptor).ptr = (IndexPropertyDescriptor *)0x0;
  (this->descriptorValidationToken).ptr = (void *)0x0;
  (this->super_JavascriptArrayIndexEnumeratorBase).index = 0xffffffff;
  (this->super_JavascriptArrayIndexEnumeratorBase).doneArray = false;
  return;
}

Assistant:

ES5ArrayIndexEnumerator::ES5ArrayIndexEnumerator(ES5Array* arrayObject, EnumeratorFlags flags, ScriptContext* scriptContext)
        : JavascriptArrayIndexEnumeratorBase(arrayObject, flags, scriptContext)
    {
        Reset();
    }